

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool __thiscall CConnman::AddNode(CConnman *this,AddedNodeParams *add)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  __type_conflict _Var4;
  uint16_t uVar5;
  uint16_t uVar6;
  CService *a;
  reference pAVar7;
  CConnman *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  AddedNodeParams *it;
  vector<AddedNodeParams,_std::allocator<AddedNodeParams>_> *__range1;
  bool resolved_is_valid;
  iterator __end1;
  iterator __begin1;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock87;
  CService resolved;
  CService *in_stack_fffffffffffffeb8;
  undefined5 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec5;
  byte in_stack_fffffffffffffec6;
  undefined1 in_stack_fffffffffffffec7;
  reference in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined2 in_stack_fffffffffffffed4;
  undefined1 in_stack_fffffffffffffed6;
  undefined1 in_stack_fffffffffffffed7;
  undefined1 uVar8;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 uVar9;
  undefined6 in_stack_fffffffffffffef0;
  undefined2 in_stack_fffffffffffffef6;
  undefined4 in_stack_ffffffffffffff08;
  undefined2 in_stack_ffffffffffffff0c;
  undefined1 in_stack_ffffffffffffff0e;
  byte bVar10;
  undefined1 in_stack_ffffffffffffff0f;
  byte bVar11;
  undefined8 in_stack_ffffffffffffff10;
  reference pAVar12;
  string *in_stack_ffffffffffffff18;
  string *name;
  bool local_b9;
  uint16_t portDefault;
  
  uVar6 = (uint16_t)((ulong)in_stack_ffffffffffffff10 >> 0x30);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = GetDefaultPort(in_RSI,(string *)
                                CONCAT26(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0));
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function(in_stack_fffffffffffffed8,
             (function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)CONCAT17(in_stack_fffffffffffffed7,
                         CONCAT16(in_stack_fffffffffffffed6,
                                  CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0))));
  LookupNumeric(in_stack_ffffffffffffff18,uVar6,
                (DNSLookupFn *)
                CONCAT17(in_stack_ffffffffffffff0f,
                         CONCAT16(in_stack_ffffffffffffff0e,
                                  CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))));
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::~function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
               *)in_stack_fffffffffffffeb8);
  bVar2 = CNetAddr::IsValid((CNetAddr *)
                            CONCAT17(in_stack_fffffffffffffed7,
                                     CONCAT16(in_stack_fffffffffffffed6,
                                              CONCAT24(in_stack_fffffffffffffed4,
                                                       in_stack_fffffffffffffed0))));
  uVar9 = bVar2;
  a = (CService *)MaybeCheckNotHeld((Mutex *)in_stack_fffffffffffffeb8);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_RSI,
             (AnnotatedMixin<std::mutex> *)CONCAT26(uVar5,in_stack_fffffffffffffef0),(char *)in_RDI,
             (char *)CONCAT17(uVar9,in_stack_fffffffffffffee0),(int)((ulong)a >> 0x20),
             SUB81((ulong)a >> 0x18,0));
  name = (string *)((long)&in_RDI[9].field_2 + 8);
  std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>::begin
            ((vector<AddedNodeParams,_std::allocator<AddedNodeParams>_> *)
             CONCAT17(in_stack_fffffffffffffec7,
                      CONCAT16(in_stack_fffffffffffffec6,
                               CONCAT15(in_stack_fffffffffffffec5,in_stack_fffffffffffffec0))));
  std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>::end
            ((vector<AddedNodeParams,_std::allocator<AddedNodeParams>_> *)
             CONCAT17(in_stack_fffffffffffffec7,
                      CONCAT16(in_stack_fffffffffffffec6,
                               CONCAT15(in_stack_fffffffffffffec5,in_stack_fffffffffffffec0))));
  do {
    bVar3 = __gnu_cxx::
            operator==<AddedNodeParams_*,_std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>_>
                      ((__normal_iterator<AddedNodeParams_*,_std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>_>
                        *)in_stack_fffffffffffffec8,
                       (__normal_iterator<AddedNodeParams_*,_std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>_>
                        *)CONCAT17(in_stack_fffffffffffffec7,
                                   CONCAT16(in_stack_fffffffffffffec6,
                                            CONCAT15(in_stack_fffffffffffffec5,
                                                     in_stack_fffffffffffffec0))));
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>::push_back
                ((vector<AddedNodeParams,_std::allocator<AddedNodeParams>_> *)
                 in_stack_fffffffffffffec8,
                 (value_type *)
                 CONCAT17(in_stack_fffffffffffffec7,
                          CONCAT16(in_stack_fffffffffffffec6,
                                   CONCAT15(in_stack_fffffffffffffec5,in_stack_fffffffffffffec0))));
      local_b9 = true;
LAB_01011a3b:
      UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffeb8);
      CService::~CService(in_stack_fffffffffffffeb8);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return local_b9;
    }
    pAVar7 = __gnu_cxx::
             __normal_iterator<AddedNodeParams_*,_std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>_>
             ::operator*((__normal_iterator<AddedNodeParams_*,_std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>_>
                          *)in_stack_fffffffffffffeb8);
    _Var4 = std::operator==(in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(uVar9,in_stack_fffffffffffffee0));
    bVar11 = 0;
    bVar10 = 0;
    uVar8 = true;
    in_stack_fffffffffffffec6 = uVar8;
    if ((!_Var4) && (in_stack_fffffffffffffec6 = false, bVar2)) {
      pAVar12 = pAVar7;
      uVar6 = GetDefaultPort(in_RSI,(string *)CONCAT26(uVar5,in_stack_fffffffffffffef0));
      portDefault = (uint16_t)((ulong)pAVar12 >> 0x30);
      std::
      function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
      ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                  *)a,(function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                       *)CONCAT17(uVar8,CONCAT16(in_stack_fffffffffffffec6,
                                                 CONCAT24(uVar6,in_stack_fffffffffffffed0))));
      bVar11 = 1;
      LookupNumeric(name,portDefault,
                    (DNSLookupFn *)
                    CONCAT17(1,CONCAT16(bVar10,CONCAT24(in_stack_ffffffffffffff0c,
                                                        in_stack_ffffffffffffff08))));
      bVar10 = 1;
      in_stack_fffffffffffffec7 =
           ::operator==(a,(CService *)
                          CONCAT17(uVar8,CONCAT16(in_stack_fffffffffffffec6,
                                                  CONCAT24(uVar6,in_stack_fffffffffffffed0))));
      in_stack_fffffffffffffec8 = pAVar7;
      in_stack_fffffffffffffec6 = in_stack_fffffffffffffec7;
    }
    if ((bVar10 & 1) != 0) {
      CService::~CService(in_stack_fffffffffffffeb8);
    }
    if ((bVar11 & 1) != 0) {
      std::
      function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
      ::~function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                   *)in_stack_fffffffffffffeb8);
    }
    if ((in_stack_fffffffffffffec6 & 1) != 0) {
      local_b9 = false;
      goto LAB_01011a3b;
    }
    __gnu_cxx::
    __normal_iterator<AddedNodeParams_*,_std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>_>
    ::operator++((__normal_iterator<AddedNodeParams_*,_std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>_>
                  *)in_stack_fffffffffffffeb8);
  } while( true );
}

Assistant:

bool CConnman::AddNode(const AddedNodeParams& add)
{
    const CService resolved(LookupNumeric(add.m_added_node, GetDefaultPort(add.m_added_node)));
    const bool resolved_is_valid{resolved.IsValid()};

    LOCK(m_added_nodes_mutex);
    for (const auto& it : m_added_node_params) {
        if (add.m_added_node == it.m_added_node || (resolved_is_valid && resolved == LookupNumeric(it.m_added_node, GetDefaultPort(it.m_added_node)))) return false;
    }

    m_added_node_params.push_back(add);
    return true;
}